

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int luaH_next(lua_State *L,Table *t,StkId key)

{
  undefined4 uVar1;
  Value VVar2;
  TValue *pTVar3;
  Node *pNVar4;
  TValue *io1_2;
  TValue *io1_1;
  TValue *io1;
  TValue *io;
  uint i;
  StkId key_local;
  Table *t_local;
  lua_State *L_local;
  
  for (io._4_4_ = findindex(L,t,key); io._4_4_ < t->sizearray; io._4_4_ = io._4_4_ + 1) {
    if (t->array[io._4_4_].tt_ != 0) {
      VVar2.i._4_4_ = 0;
      VVar2.b = io._4_4_ + 1;
      key->value_ = VVar2;
      key->tt_ = 0x13;
      pTVar3 = t->array + io._4_4_;
      key[1].value_ = pTVar3->value_;
      uVar1 = *(undefined4 *)&pTVar3->field_0xc;
      key[1].tt_ = pTVar3->tt_;
      *(undefined4 *)&key[1].field_0xc = uVar1;
      return 1;
    }
  }
  io._4_4_ = io._4_4_ - t->sizearray;
  while( true ) {
    if (1 << (t->lsizenode & 0x1f) <= (int)io._4_4_) {
      return 0;
    }
    if (t->node[io._4_4_].i_val.tt_ != 0) break;
    io._4_4_ = io._4_4_ + 1;
  }
  pNVar4 = t->node;
  key->value_ = pNVar4[io._4_4_].i_key.nk.value_;
  *(undefined8 *)&key->tt_ = *(undefined8 *)((long)&pNVar4[io._4_4_].i_key + 8);
  pNVar4 = t->node + io._4_4_;
  key[1].value_ = (pNVar4->i_val).value_;
  uVar1 = *(undefined4 *)&(pNVar4->i_val).field_0xc;
  key[1].tt_ = (pNVar4->i_val).tt_;
  *(undefined4 *)&key[1].field_0xc = uVar1;
  return 1;
}

Assistant:

int luaH_next(lua_State *L, Table *t, StkId key) {
    unsigned int i = findindex(L, t, key);  /* find original element */
    for (; i < t->sizearray; i++) {  /* try first array part */
        if (!ttisnil(&t->array[i])) {  /* a non-nil value? */
            setivalue(key, i + 1);
            setobj2s(L, key + 1, &t->array[i]);
            return 1;
        }
    }
    for (i -= t->sizearray; cast_int(i) < sizenode(t); i++) {  /* hash part */
        if (!ttisnil(gval(gnode(t, i)))) {  /* a non-nil value? */
            setobj2s(L, key, gkey(gnode(t, i)));
            setobj2s(L, key + 1, gval(gnode(t, i)));
            return 1;
        }
    }
    return 0;  /* no more elements */
}